

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmVariableDefinitions
                    (ExpressionContext *ctx,VmModule *module,ExprVariableDefinitions *node)

{
  VmValue *pVVar1;
  ExprBase *local_28;
  ExprBase *value;
  ExprVariableDefinitions *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  for (local_28 = (node->definitions).head; local_28 != (ExprBase *)0x0; local_28 = local_28->next)
  {
    CompileVm(ctx,module,local_28);
  }
  pVVar1 = anon_unknown.dwarf_c91b1::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmVariableDefinitions(ExpressionContext &ctx, VmModule *module, ExprVariableDefinitions *node)
{
	for(ExprBase *value = node->definitions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	return CheckType(ctx, node, CreateVoid(module));
}